

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::updateSample(QFontDialogPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text((QString *)&local_50,this->sizeEdit);
  QString::toInt((QString *)&local_50,(bool *)0x0,10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFontListView::currentText((QString *)&local_50,this->familyList);
  QFontDatabase::font((QString *)&local_38,(QString *)&local_50,(int)this + 0x3b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QAbstractButton::isChecked(&this->strikeout->super_QAbstractButton);
  bVar1 = SUB81(&local_38,0);
  QFont::setStrikeOut(bVar1);
  QAbstractButton::isChecked(&this->underline->super_QAbstractButton);
  QFont::setUnderline(bVar1);
  QFontListView::currentText((QString *)&local_50,this->familyList);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (local_50.size == 0) {
    QLineEdit::clear(this->sampleEdit);
  }
  updateSampleFont(this,(QFont *)&local_38);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::updateSample()
{
    // compute new font
    int pSize = sizeEdit->text().toInt();
    QFont newFont(QFontDatabase::font(familyList->currentText(), style, pSize));
    newFont.setStrikeOut(strikeout->isChecked());
    newFont.setUnderline(underline->isChecked());

    if (familyList->currentText().isEmpty())
        sampleEdit->clear();

    updateSampleFont(newFont);
}